

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9InputFormat(_func_int_jx9_context_ptr_char_ptr_int_void_ptr *xConsumer,jx9_context *pCtx,
                    char *zIn,int nByte,int nArg,jx9_value **apArg,void *pUserData,int vf)

{
  jx9_fmt_info **ppjVar1;
  sxi32 sVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  jx9_fmt_info **ppjVar6;
  bool bVar7;
  double dVar8;
  bool local_5b0;
  bool local_5ad;
  jx9_value *local_5a8;
  jx9_value *local_598;
  jx9_value *local_590;
  jx9_value *local_588;
  bool local_571;
  int local_558;
  int local_554;
  int nspace_1;
  int nspace;
  int nPad;
  int i;
  int nsd;
  int flag_exp;
  int flag_rtz;
  int flag_dp;
  double rounder;
  undefined1 auStack_528 [4];
  int exp;
  longdouble realvalue;
  undefined1 local_511;
  char *pcStack_510;
  char x;
  char *pre;
  char *pcStack_500;
  int base;
  char *cset;
  int idx;
  int width;
  int iStack_4e8;
  sxu8 xtype;
  int prefix;
  int length;
  int n;
  int rc;
  int c;
  char *zExtra;
  long lStack_4c8;
  int precision;
  jx9_int64 iVal;
  jx9_value *pArg;
  int local_4b0;
  int flag_zeropad;
  int flag_plussign;
  int flag_blanksign;
  int flag_leftjustify;
  int flag_alternateform;
  jx9_fmt_info *pInfo;
  char zWorker [1024];
  jx9_fmt_info **local_90;
  char *zBuf;
  char *zEnd;
  char *zCur;
  char spaces [51];
  jx9_value **apArg_local;
  int nArg_local;
  int nByte_local;
  char *zIn_local;
  jx9_context *pCtx_local;
  _func_int_jx9_context_ptr_char_ptr_int_void_ptr *xConsumer_local;
  
  memcpy(&zCur,"                                                  ",0x33);
  pcVar4 = zIn + nByte;
  prefix = (int)(vf != 1);
  _nArg_local = zIn;
  do {
    while( true ) {
      bVar7 = false;
      if (_nArg_local < pcVar4) {
        bVar7 = *_nArg_local != '%';
      }
      if (!bVar7) break;
      _nArg_local = _nArg_local + 1;
    }
    if (((zIn < _nArg_local) &&
        (length = (*xConsumer)(pCtx,zIn,(int)_nArg_local - (int)zIn,pUserData), length == -10)) ||
       (pcVar4 <= _nArg_local)) {
      return 0;
    }
    pArg._4_4_ = 0;
    flag_blanksign = 0;
    flag_zeropad = 0;
    local_4b0 = 0;
    flag_plussign = 0;
    _nArg_local = _nArg_local + 1;
    do {
      pcVar5 = _nArg_local;
      n = (int)*_nArg_local;
      if (n - 0x20U < 0x10 || n == 0x30) {
        sVar2 = (*(code *)(&DAT_00165b40 + *(int *)(&DAT_00165b40 + (ulong)(n - 0x20U) * 4)))();
        return sVar2;
      }
      if (n == 0) {
        _nArg_local = _nArg_local + 1;
      }
      local_571 = n == 0 && pcVar5 < pcVar4;
    } while (local_571);
    cset._4_4_ = 0;
    while( true ) {
      bVar7 = false;
      if ((_nArg_local < pcVar4) && (bVar7 = false, '/' < *_nArg_local)) {
        bVar7 = *_nArg_local < ':';
      }
      if (!bVar7) break;
      cset._4_4_ = cset._4_4_ * 10 + *_nArg_local + -0x30;
      _nArg_local = _nArg_local + 1;
    }
    if ((_nArg_local < pcVar4) && (*_nArg_local == '$')) {
      if ((0 < cset._4_4_) && ((prefix = cset._4_4_, vf != 0 && (0 < cset._4_4_)))) {
        prefix = cset._4_4_ + -1;
      }
      pcVar5 = _nArg_local + 1;
      cset._4_4_ = 0;
      if ((pcVar5 < pcVar4) && (*pcVar5 == '0')) {
        pArg._4_4_ = 1;
        pcVar5 = _nArg_local + 2;
      }
      while( true ) {
        _nArg_local = pcVar5;
        bVar7 = false;
        if ((_nArg_local < pcVar4) && (bVar7 = false, '/' < *_nArg_local)) {
          bVar7 = *_nArg_local < ':';
        }
        if (!bVar7) break;
        cset._4_4_ = cset._4_4_ * 10 + *_nArg_local + -0x30;
        pcVar5 = _nArg_local + 1;
      }
    }
    if (0x3f6 < cset._4_4_) {
      cset._4_4_ = 0x3f6;
    }
    zExtra._4_4_ = -1;
    if ((_nArg_local < pcVar4) && (*_nArg_local == '.')) {
      zExtra._4_4_ = 0;
      while( true ) {
        _nArg_local = _nArg_local + 1;
        bVar7 = false;
        if ((_nArg_local < pcVar4) && (bVar7 = false, '/' < *_nArg_local)) {
          bVar7 = *_nArg_local < ':';
        }
        if (!bVar7) break;
        zExtra._4_4_ = zExtra._4_4_ * 10 + *_nArg_local + -0x30;
      }
    }
    if (pcVar4 <= _nArg_local) {
      return 0;
    }
    _flag_leftjustify = (jx9_fmt_info *)0x0;
    idx._3_1_ = '\t';
    n = (int)*_nArg_local;
    _nArg_local = _nArg_local + 1;
    for (cset._0_4_ = 0; (int)cset < 0xf; cset._0_4_ = (int)cset + 1) {
      if (n == aFmt[(int)cset].fmttype) {
        _flag_leftjustify = aFmt + (int)cset;
        idx._3_1_ = aFmt[(int)cset].type;
        break;
      }
    }
    local_90 = &pInfo;
    iStack_4e8 = 0;
    _rc = 0;
    switch(idx._3_1_) {
    case '\x01':
      if (prefix < nArg) {
        local_598 = apArg[prefix];
        prefix = prefix + 1;
      }
      else {
        local_598 = (jx9_value *)0x0;
      }
      iVal = (jx9_int64)local_598;
      if (local_598 == (jx9_value *)0x0) {
        lStack_4c8 = 0;
      }
      else {
        lStack_4c8 = jx9_value_to_int64(local_598);
      }
      if (0x3d8 < zExtra._4_4_) {
        zExtra._4_4_ = 0x3d8;
      }
      if (lStack_4c8 == 0) {
        flag_blanksign = 0;
      }
      if ((_flag_leftjustify->flags & 1U) == 0) {
        if ((lStack_4c8 < 0) && (bVar7 = 0 < lStack_4c8, lStack_4c8 = -lStack_4c8, bVar7)) {
          lStack_4c8 = 0x7fffffffffffffff;
        }
        width = 0;
      }
      else if (lStack_4c8 < 0) {
        bVar7 = 0 < lStack_4c8;
        lStack_4c8 = -lStack_4c8;
        if (bVar7) {
          lStack_4c8 = 0x7fffffffffffffff;
        }
        width = 0x2d;
      }
      else if (local_4b0 == 0) {
        if (flag_zeropad == 0) {
          width = 0;
        }
        else {
          width = 0x20;
        }
      }
      else {
        width = 0x2b;
      }
      if ((pArg._4_4_ != 0) && (zExtra._4_4_ < (int)(cset._4_4_ - (uint)(width != 0)))) {
        zExtra._4_4_ = cset._4_4_ - (uint)(width != 0);
      }
      pcStack_500 = _flag_leftjustify->charset;
      pre._4_4_ = (uint)_flag_leftjustify->base;
      local_90 = (jx9_fmt_info **)(zWorker + 0x3f7);
      do {
        ppjVar6 = (jx9_fmt_info **)((long)local_90 + -1);
        *(char *)((long)local_90 + -1) = pcStack_500[lStack_4c8 % (long)(int)pre._4_4_];
        lStack_4c8 = lStack_4c8 / (long)(int)pre._4_4_;
        local_90 = ppjVar6;
      } while (0 < lStack_4c8);
      for (cset._0_4_ = zExtra._4_4_ - (((int)&pInfo + 0x3ff) - (int)ppjVar6); 0 < (int)cset;
          cset._0_4_ = (int)cset + -1) {
        *(char *)((long)local_90 + -1) = '0';
        local_90 = (jx9_fmt_info **)((long)local_90 + -1);
      }
      if (width != 0) {
        *(char *)((long)local_90 + -1) = (char)width;
        local_90 = (jx9_fmt_info **)((long)local_90 + -1);
      }
      if (((flag_blanksign != 0) && (_flag_leftjustify->prefix != (char *)0x0)) &&
         (pcStack_510 = _flag_leftjustify->prefix, *(char *)local_90 != *pcStack_510)) {
        for (pcStack_510 = _flag_leftjustify->prefix; *pcStack_510 != '\0';
            pcStack_510 = pcStack_510 + 1) {
          *(char *)((long)local_90 + -1) = *pcStack_510;
          local_90 = (jx9_fmt_info **)((long)local_90 + -1);
        }
        local_511 = 0;
      }
      iStack_4e8 = ((int)&pInfo + 0x3ff) - (int)local_90;
      break;
    case '\x02':
    case '\x03':
    case '\x04':
      if (prefix < nArg) {
        local_5a8 = apArg[prefix];
        prefix = prefix + 1;
      }
      else {
        local_5a8 = (jx9_value *)0x0;
      }
      iVal = (jx9_int64)local_5a8;
      if (local_5a8 == (jx9_value *)0x0) {
        _auStack_528 = (longdouble)0;
      }
      else {
        dVar8 = jx9_value_to_double(local_5a8);
        _auStack_528 = (longdouble)dVar8;
      }
      if (zExtra._4_4_ < 0) {
        zExtra._4_4_ = 6;
      }
      if (0x3d8 < zExtra._4_4_) {
        zExtra._4_4_ = 0x3d8;
      }
      if ((longdouble)0 <= _auStack_528) {
        if (local_4b0 == 0) {
          if (flag_zeropad == 0) {
            width = 0;
          }
          else {
            width = 0x20;
          }
        }
        else {
          width = 0x2b;
        }
      }
      else {
        _auStack_528 = -_auStack_528;
        width = 0x2d;
      }
      if ((_flag_leftjustify->type == '\x04') && (0 < zExtra._4_4_)) {
        zExtra._4_4_ = zExtra._4_4_ + -1;
      }
      _flag_rtz = 0.5;
      for (cset._0_4_ = zExtra._4_4_; 0 < (int)cset; cset._0_4_ = (int)cset + -1) {
        _flag_rtz = _flag_rtz * 0.1;
      }
      if (_flag_leftjustify->type == '\x02') {
        _auStack_528 = _auStack_528 + (longdouble)_flag_rtz;
      }
      rounder._4_4_ = 0;
      if ((longdouble)0 < _auStack_528) {
        for (; (longdouble)1e+08 <= _auStack_528 && rounder._4_4_ < 0x15f;
            _auStack_528 = (longdouble)1e-08 * _auStack_528) {
          rounder._4_4_ = rounder._4_4_ + 8;
        }
        for (; (longdouble)10.0 <= _auStack_528 && rounder._4_4_ < 0x15f;
            _auStack_528 = (longdouble)0.1 * _auStack_528) {
          rounder._4_4_ = rounder._4_4_ + 1;
        }
        for (; _auStack_528 < (longdouble)1e-08 && -0x15f < rounder._4_4_;
            _auStack_528 = (longdouble)1e+08 * _auStack_528) {
          rounder._4_4_ = rounder._4_4_ + -8;
        }
        for (; _auStack_528 < (longdouble)1 && -0x15f < rounder._4_4_;
            _auStack_528 = (longdouble)10.0 * _auStack_528) {
          rounder._4_4_ = rounder._4_4_ + -1;
        }
        if ((0x15e < rounder._4_4_) || (rounder._4_4_ < -0x15e)) {
          local_90 = (jx9_fmt_info **)0x166aac;
          iStack_4e8 = 3;
          break;
        }
      }
      local_90 = &pInfo;
      i = (int)(idx._3_1_ == '\x03');
      if ((idx._3_1_ != '\x02') &&
         (_auStack_528 = _auStack_528 + (longdouble)_flag_rtz, (longdouble)10.0 <= _auStack_528)) {
        _auStack_528 = (longdouble)0.1 * _auStack_528;
        rounder._4_4_ = rounder._4_4_ + 1;
      }
      if (idx._3_1_ == '\x04') {
        nsd = (int)((flag_blanksign != 0 ^ 0xffU) & 1);
        if ((rounder._4_4_ < -4) || (zExtra._4_4_ < rounder._4_4_)) {
          idx._3_1_ = '\x03';
        }
        else {
          zExtra._4_4_ = zExtra._4_4_ - rounder._4_4_;
          idx._3_1_ = '\x02';
        }
      }
      else {
        nsd = 0;
      }
      nPad = 0;
      if ((idx._3_1_ == '\x02') && (rounder._4_4_ + zExtra._4_4_ < 0x3e2)) {
        local_5ad = 0 < zExtra._4_4_ || flag_blanksign != 0;
        flag_exp = (int)local_5ad;
        if (width != 0) {
          local_90 = (jx9_fmt_info **)((long)&pInfo + 1);
          pInfo._0_1_ = (char)width;
        }
        if (rounder._4_4_ < 0) {
          *(undefined1 *)local_90 = 0x30;
          local_90 = (jx9_fmt_info **)((long)local_90 + 1);
        }
        else {
          for (; -1 < rounder._4_4_; rounder._4_4_ = rounder._4_4_ + -1) {
            iVar3 = vxGetdigit((sxlongreal *)auStack_528,&nPad);
            *(char *)local_90 = (char)iVar3;
            local_90 = (jx9_fmt_info **)((long)local_90 + 1);
          }
        }
        if (flag_exp != 0) {
          *(undefined1 *)local_90 = 0x2e;
          local_90 = (jx9_fmt_info **)((long)local_90 + 1);
        }
        for (; rounder._4_4_ = rounder._4_4_ + 1, rounder._4_4_ < 0 && 0 < zExtra._4_4_;
            zExtra._4_4_ = zExtra._4_4_ + -1) {
          *(undefined1 *)local_90 = 0x30;
          local_90 = (jx9_fmt_info **)((long)local_90 + 1);
        }
        while (0 < zExtra._4_4_) {
          zExtra._4_4_ = zExtra._4_4_ + -1;
          iVar3 = vxGetdigit((sxlongreal *)auStack_528,&nPad);
          *(char *)local_90 = (char)iVar3;
          local_90 = (jx9_fmt_info **)((long)local_90 + 1);
        }
        ppjVar6 = (jx9_fmt_info **)((long)local_90 + -1);
        *(undefined1 *)local_90 = 0;
        local_90 = ppjVar6;
        if ((nsd != 0) && (flag_exp != 0)) {
          while( true ) {
            bVar7 = false;
            if (&pInfo <= local_90) {
              bVar7 = *(char *)local_90 == '0';
            }
            if (!bVar7) break;
            *(char *)local_90 = '\0';
            local_90 = (jx9_fmt_info **)((long)local_90 + -1);
          }
          if ((&pInfo <= local_90) && (*(char *)local_90 == '.')) {
            *(char *)local_90 = '\0';
            local_90 = (jx9_fmt_info **)((long)local_90 + -1);
          }
        }
        local_90._0_4_ = (int)local_90 + 1;
        zExtra._4_4_ = zExtra._4_4_ + -1;
      }
      else {
        local_5b0 = 0 < zExtra._4_4_ || flag_blanksign != 0;
        flag_exp = (int)local_5b0;
        if (width != 0) {
          local_90 = (jx9_fmt_info **)((long)&pInfo + 1);
          pInfo._0_1_ = (char)width;
        }
        iVar3 = vxGetdigit((sxlongreal *)auStack_528,&nPad);
        *(char *)local_90 = (char)iVar3;
        ppjVar6 = (jx9_fmt_info **)((long)local_90 + 1);
        if (flag_exp != 0) {
          *(undefined1 *)((long)local_90 + 1) = 0x2e;
          ppjVar6 = (jx9_fmt_info **)((long)local_90 + 2);
        }
        while (local_90 = ppjVar6, 0 < zExtra._4_4_) {
          zExtra._4_4_ = zExtra._4_4_ + -1;
          iVar3 = vxGetdigit((sxlongreal *)auStack_528,&nPad);
          *(char *)local_90 = (char)iVar3;
          ppjVar6 = (jx9_fmt_info **)((long)local_90 + 1);
        }
        local_90 = (jx9_fmt_info **)((long)local_90 + -1);
        if ((nsd != 0) && (flag_exp != 0)) {
          while( true ) {
            bVar7 = false;
            if (&pInfo <= local_90) {
              bVar7 = *(char *)local_90 == '0';
            }
            if (!bVar7) break;
            *(char *)local_90 = '\0';
            local_90 = (jx9_fmt_info **)((long)local_90 + -1);
          }
          if ((&pInfo <= local_90) && (*(char *)local_90 == '.')) {
            *(char *)local_90 = '\0';
            local_90 = (jx9_fmt_info **)((long)local_90 + -1);
          }
        }
        ppjVar6 = local_90;
        if ((rounder._4_4_ != 0) || (ppjVar1 = (jx9_fmt_info **)((long)local_90 + 1), i != 0)) {
          *(char *)((long)local_90 + 1) = *_flag_leftjustify->charset;
          if (rounder._4_4_ < 0) {
            *(char *)((long)local_90 + 2) = '-';
            rounder._4_4_ = -rounder._4_4_;
          }
          else {
            *(char *)((long)local_90 + 2) = '+';
          }
          local_90 = (jx9_fmt_info **)((long)local_90 + 3);
          if (99 < rounder._4_4_) {
            *(char *)local_90 = (char)(rounder._4_4_ / 100) + '0';
            rounder._4_4_ = rounder._4_4_ % 100;
            local_90 = (jx9_fmt_info **)((long)ppjVar6 + 4);
          }
          *(char *)local_90 = (char)(rounder._4_4_ / 10) + '0';
          *(char *)((long)local_90 + 1) = (char)(rounder._4_4_ % 10) + '0';
          ppjVar1 = (jx9_fmt_info **)((long)local_90 + 2);
        }
        local_90 = ppjVar1;
        zExtra._4_4_ = zExtra._4_4_ + -1;
      }
      iStack_4e8 = (int)local_90 - (int)&pInfo;
      local_90 = &pInfo;
      if (((pArg._4_4_ != 0) && (flag_plussign == 0)) && (iStack_4e8 < cset._4_4_)) {
        nspace_1 = cset._4_4_ - iStack_4e8;
        for (nspace = cset._4_4_; nspace_1 <= nspace; nspace = nspace + -1) {
          *(undefined1 *)((long)local_90 + (long)nspace) =
               *(undefined1 *)((long)local_90 + (long)(nspace - nspace_1));
        }
        nspace = (uint)(width != 0);
        while (nspace_1 != 0) {
          *(undefined1 *)((long)local_90 + (long)nspace) = 0x30;
          nspace_1 = nspace_1 + -1;
          nspace = nspace + 1;
        }
        iStack_4e8 = cset._4_4_;
      }
      break;
    default:
      pInfo._0_1_ = 0x3f;
      iStack_4e8 = 1;
      break;
    case '\x06':
      if (prefix < nArg) {
        local_590 = apArg[prefix];
        prefix = prefix + 1;
      }
      else {
        local_590 = (jx9_value *)0x0;
      }
      iVal = (jx9_int64)local_590;
      if (local_590 == (jx9_value *)0x0) {
        iStack_4e8 = 0;
      }
      else {
        local_90 = (jx9_fmt_info **)jx9_value_to_string(local_590,&stack0xfffffffffffffb18);
      }
      if (iStack_4e8 < 1) {
        local_90 = (jx9_fmt_info **)0x16ae19;
        iStack_4e8 = 1;
      }
      if ((-1 < zExtra._4_4_) && (zExtra._4_4_ < iStack_4e8)) {
        iStack_4e8 = zExtra._4_4_;
      }
      if (pArg._4_4_ != 0) {
        for (cset._0_4_ = 0; (int)cset < 0x32; cset._0_4_ = (int)cset + 1) {
          spaces[(long)(int)cset + -8] = '0';
        }
      }
      break;
    case '\a':
      pInfo._0_1_ = 0x25;
      iStack_4e8 = 1;
      break;
    case '\b':
      if (prefix < nArg) {
        local_588 = apArg[prefix];
        prefix = prefix + 1;
      }
      else {
        local_588 = (jx9_value *)0x0;
      }
      iVal = (jx9_int64)local_588;
      if (local_588 == (jx9_value *)0x0) {
        n = 0;
      }
      else {
        n = jx9_value_to_int(local_588);
      }
      pInfo._0_1_ = (undefined1)n;
      iStack_4e8 = 1;
    }
    if ((flag_plussign == 0) && (local_554 = cset._4_4_ - iStack_4e8, 0 < local_554)) {
      for (; 0x31 < local_554; local_554 = local_554 + -0x32) {
        iVar3 = (*xConsumer)(pCtx,(char *)&zCur,0x32,pUserData);
        if (iVar3 != 0) {
          return -10;
        }
        length = 0;
      }
      if (0 < local_554) {
        iVar3 = (*xConsumer)(pCtx,(char *)&zCur,local_554,pUserData);
        if (iVar3 != 0) {
          return -10;
        }
        length = 0;
      }
    }
    if (0 < iStack_4e8) {
      iVar3 = (*xConsumer)(pCtx,(char *)local_90,iStack_4e8,pUserData);
      if (iVar3 != 0) {
        return -10;
      }
      length = 0;
    }
    zIn = _nArg_local;
    if ((flag_plussign != 0) && (local_558 = cset._4_4_ - iStack_4e8, 0 < local_558)) {
      for (; 0x31 < local_558; local_558 = local_558 + -0x32) {
        iVar3 = (*xConsumer)(pCtx,(char *)&zCur,0x32,pUserData);
        if (iVar3 != 0) {
          return -10;
        }
        length = 0;
      }
      if (0 < local_558) {
        iVar3 = (*xConsumer)(pCtx,(char *)&zCur,local_558,pUserData);
        if (iVar3 != 0) {
          return -10;
        }
        length = 0;
      }
    }
  } while( true );
}

Assistant:

JX9_PRIVATE sxi32 jx9InputFormat(
	int (*xConsumer)(jx9_context *, const char *, int, void *), /* Format consumer */
	jx9_context *pCtx,  /* call context */
	const char *zIn,    /* Format string */
	int nByte,          /* Format string length */
	int nArg,           /* Total argument of the given arguments */
	jx9_value **apArg,  /* User arguments */
	void *pUserData,    /* Last argument to xConsumer() */
	int vf              /* TRUE if called from vfprintf, vsprintf context */ 
	)
{
	char spaces[] = "                                                  ";
#define etSPACESIZE ((int)sizeof(spaces)-1)
	const char *zCur, *zEnd = &zIn[nByte];
	char *zBuf, zWorker[JX9_FMT_BUFSIZ];       /* Working buffer */
	const jx9_fmt_info *pInfo;  /* Pointer to the appropriate info structure */
	int flag_alternateform; /* True if "#" flag is present */
	int flag_leftjustify;   /* True if "-" flag is present */
	int flag_blanksign;     /* True if " " flag is present */
	int flag_plussign;      /* True if "+" flag is present */
	int flag_zeropad;       /* True if field width constant starts with zero */
	jx9_value *pArg;         /* Current processed argument */
	jx9_int64 iVal;
	int precision;           /* Precision of the current field */
	char *zExtra;  
	int c, rc, n;
	int length;              /* Length of the field */
	int prefix;
	sxu8 xtype;              /* Conversion paradigm */
	int width;               /* Width of the current field */
	int idx;
	n = (vf == TRUE) ? 0 : 1;
#define NEXT_ARG	( n < nArg ? apArg[n++] : 0 )
	/* Start the format process */
	for(;;){
		zCur = zIn;
		while( zIn < zEnd && zIn[0] != '%' ){
			zIn++;
		}
		if( zCur < zIn ){
			/* Consume chunk verbatim */
			rc = xConsumer(pCtx, zCur, (int)(zIn-zCur), pUserData);
			if( rc == SXERR_ABORT ){
				/* Callback request an operation abort */
				break;
			}
		}
		if( zIn >= zEnd ){
			/* No more input to process, break immediately */
			break;
		}
		/* Find out what flags are present */
		flag_leftjustify = flag_plussign = flag_blanksign = 
			flag_alternateform = flag_zeropad = 0;
		zIn++; /* Jump the precent sign */
		do{
			c = zIn[0];
			switch( c ){
			case '-':   flag_leftjustify = 1;     c = 0;   break;
			case '+':   flag_plussign = 1;        c = 0;   break;
			case ' ':   flag_blanksign = 1;       c = 0;   break;
			case '#':   flag_alternateform = 1;   c = 0;   break;
			case '0':   flag_zeropad = 1;         c = 0;   break;
			case '\'':
				zIn++;
				if( zIn < zEnd ){
					/* An alternate padding character can be specified by prefixing it with a single quote (') */
					c = zIn[0];
					for(idx = 0 ; idx < etSPACESIZE ; ++idx ){
						spaces[idx] = (char)c;
					}
					c = 0;
				}
				break;
			default:                                       break;
			}
		}while( c==0 && (zIn++ < zEnd) );
		/* Get the field width */
		width = 0;
		while( zIn < zEnd && ( zIn[0] >='0' && zIn[0] <='9') ){
			width = width*10 + (zIn[0] - '0');
			zIn++;
		}
		if( zIn < zEnd && zIn[0] == '$' ){
			/* Position specifer */
			if( width > 0 ){
				n = width;
				if( vf && n > 0 ){ 
					n--;
				}
			}
			zIn++;
			width = 0;
			if( zIn < zEnd && zIn[0] == '0' ){
				flag_zeropad = 1;
				zIn++;
			}
			while( zIn < zEnd && ( zIn[0] >='0' && zIn[0] <='9') ){
				width = width*10 + (zIn[0] - '0');
				zIn++;
			}
		}
		if( width > JX9_FMT_BUFSIZ-10 ){
			width = JX9_FMT_BUFSIZ-10;
		}
		/* Get the precision */
		precision = -1;
		if( zIn < zEnd && zIn[0] == '.' ){
			precision = 0;
			zIn++;
			while( zIn < zEnd && ( zIn[0] >='0' && zIn[0] <='9') ){
				precision = precision*10 + (zIn[0] - '0');
				zIn++;
			}
		}
		if( zIn >= zEnd ){
			/* No more input */
			break;
		}
		/* Fetch the info entry for the field */
		pInfo = 0;
		xtype = JX9_FMT_ERROR;
		c = zIn[0];
		zIn++; /* Jump the format specifer */
		for(idx=0; idx< (int)SX_ARRAYSIZE(aFmt); idx++){
			if( c==aFmt[idx].fmttype ){
				pInfo = &aFmt[idx];
				xtype = pInfo->type;
				break;
			}
		}
		zBuf = zWorker; /* Point to the working buffer */
		length = 0;
		zExtra = 0;
		 /*
		  ** At this point, variables are initialized as follows:
		  **
		  **   flag_alternateform          TRUE if a '#' is present.
		  **   flag_plussign               TRUE if a '+' is present.
		  **   flag_leftjustify            TRUE if a '-' is present or if the
		  **                               field width was negative.
		  **   flag_zeropad                TRUE if the width began with 0.
		  **                               the conversion character.
		  **   flag_blanksign              TRUE if a ' ' is present.
		  **   width                       The specified field width.  This is
		  **                               always non-negative.  Zero is the default.
		  **   precision                   The specified precision.  The default
		  **                               is -1.
		  */
		switch(xtype){
		case JX9_FMT_PERCENT:
			/* A literal percent character */
			zWorker[0] = '%';
			length = (int)sizeof(char);
			break;
		case JX9_FMT_CHARX:
			/* The argument is treated as an integer, and presented as the character
			 * with that ASCII value
			 */
			pArg = NEXT_ARG;
			if( pArg == 0 ){
				c = 0;
			}else{
				c = jx9_value_to_int(pArg);
			}
			/* NUL byte is an acceptable value */
			zWorker[0] = (char)c;
			length = (int)sizeof(char);
			break;
		case JX9_FMT_STRING:
			/* the argument is treated as and presented as a string */
			pArg = NEXT_ARG;
			if( pArg == 0 ){
				length = 0;
			}else{
				zBuf = (char *)jx9_value_to_string(pArg, &length);
			}
			if( length < 1 ){
				zBuf = " ";
				length = (int)sizeof(char);
			}
			if( precision>=0 && precision<length ){
				length = precision;
			}
			if( flag_zeropad ){
				/* zero-padding works on strings too */
				for(idx = 0 ; idx < etSPACESIZE ; ++idx ){
					spaces[idx] = '0';
				}
			}
			break;
		case JX9_FMT_RADIX:
			pArg = NEXT_ARG;
			if( pArg == 0 ){
				iVal = 0;
			}else{
				iVal = jx9_value_to_int64(pArg);
			}
			/* Limit the precision to prevent overflowing buf[] during conversion */
			if( precision>JX9_FMT_BUFSIZ-40 ){
				precision = JX9_FMT_BUFSIZ-40;
			}
#if 1
        /* For the format %#x, the value zero is printed "0" not "0x0".
        ** I think this is stupid.*/
        if( iVal==0 ) flag_alternateform = 0;
#else
        /* More sensible: turn off the prefix for octal (to prevent "00"), 
        ** but leave the prefix for hex.*/
        if( iVal==0 && pInfo->base==8 ) flag_alternateform = 0;
#endif
        if( pInfo->flags & JX9_FMT_FLAG_SIGNED ){
          if( iVal<0 ){ 
            iVal = -iVal;
			/* Ticket 1433-003 */
			if( iVal < 0 ){
				/* Overflow */
				iVal= 0x7FFFFFFFFFFFFFFF;
			}
            prefix = '-';
          }else if( flag_plussign )  prefix = '+';
          else if( flag_blanksign )  prefix = ' ';
          else                       prefix = 0;
        }else{
			if( iVal<0 ){
				iVal = -iVal;
				/* Ticket 1433-003 */
				if( iVal < 0 ){
					/* Overflow */
					iVal= 0x7FFFFFFFFFFFFFFF;
				}
			}
			prefix = 0;
		}
        if( flag_zeropad && precision<width-(prefix!=0) ){
          precision = width-(prefix!=0);
        }
        zBuf = &zWorker[JX9_FMT_BUFSIZ-1];
        {
          register char *cset;      /* Use registers for speed */
          register int base;
          cset = pInfo->charset;
          base = pInfo->base;
          do{                                           /* Convert to ascii */
            *(--zBuf) = cset[iVal%base];
            iVal = iVal/base;
          }while( iVal>0 );
        }
        length = (int)(&zWorker[JX9_FMT_BUFSIZ-1]-zBuf);
        for(idx=precision-length; idx>0; idx--){
          *(--zBuf) = '0';                             /* Zero pad */
        }
        if( prefix ) *(--zBuf) = (char)prefix;               /* Add sign */
        if( flag_alternateform && pInfo->prefix ){      /* Add "0" or "0x" */
          char *pre, x;
          pre = pInfo->prefix;
          if( *zBuf!=pre[0] ){
            for(pre=pInfo->prefix; (x=(*pre))!=0; pre++) *(--zBuf) = x;
          }
        }
        length = (int)(&zWorker[JX9_FMT_BUFSIZ-1]-zBuf);
		break;
		case JX9_FMT_FLOAT:
		case JX9_FMT_EXP:
		case JX9_FMT_GENERIC:{
#ifndef JX9_OMIT_FLOATING_POINT
		long double realvalue;
		int  exp;                /* exponent of real numbers */
		double rounder;          /* Used for rounding floating point values */
		int flag_dp;            /* True if decimal point should be shown */
		int flag_rtz;           /* True if trailing zeros should be removed */
		int flag_exp;           /* True to force display of the exponent */
		int nsd;                 /* Number of significant digits returned */
		pArg = NEXT_ARG;
		if( pArg == 0 ){
			realvalue = 0;
		}else{
			realvalue = jx9_value_to_double(pArg);
		}
        if( precision<0 ) precision = 6;         /* Set default precision */
        if( precision>JX9_FMT_BUFSIZ-40) precision = JX9_FMT_BUFSIZ-40;
        if( realvalue<0.0 ){
          realvalue = -realvalue;
          prefix = '-';
        }else{
          if( flag_plussign )          prefix = '+';
          else if( flag_blanksign )    prefix = ' ';
          else                         prefix = 0;
        }
        if( pInfo->type==JX9_FMT_GENERIC && precision>0 ) precision--;
        rounder = 0.0;
#if 0
        /* Rounding works like BSD when the constant 0.4999 is used.Wierd! */
        for(idx=precision, rounder=0.4999; idx>0; idx--, rounder*=0.1);
#else
        /* It makes more sense to use 0.5 */
        for(idx=precision, rounder=0.5; idx>0; idx--, rounder*=0.1);
#endif
        if( pInfo->type==JX9_FMT_FLOAT ) realvalue += rounder;
        /* Normalize realvalue to within 10.0 > realvalue >= 1.0 */
        exp = 0;
        if( realvalue>0.0 ){
          while( realvalue>=1e8 && exp<=350 ){ realvalue *= 1e-8; exp+=8; }
          while( realvalue>=10.0 && exp<=350 ){ realvalue *= 0.1; exp++; }
          while( realvalue<1e-8 && exp>=-350 ){ realvalue *= 1e8; exp-=8; }
          while( realvalue<1.0 && exp>=-350 ){ realvalue *= 10.0; exp--; }
          if( exp>350 || exp<-350 ){
            zBuf = "NaN";
            length = 3;
            break;
          }
        }
        zBuf = zWorker;
        /*
        ** If the field type is etGENERIC, then convert to either etEXP
        ** or etFLOAT, as appropriate.
        */
        flag_exp = xtype==JX9_FMT_EXP;
        if( xtype!=JX9_FMT_FLOAT ){
          realvalue += rounder;
          if( realvalue>=10.0 ){ realvalue *= 0.1; exp++; }
        }
        if( xtype==JX9_FMT_GENERIC ){
          flag_rtz = !flag_alternateform;
          if( exp<-4 || exp>precision ){
            xtype = JX9_FMT_EXP;
          }else{
            precision = precision - exp;
            xtype = JX9_FMT_FLOAT;
          }
        }else{
          flag_rtz = 0;
        }
        /*
        ** The "exp+precision" test causes output to be of type etEXP if
        ** the precision is too large to fit in buf[].
        */
        nsd = 0;
        if( xtype==JX9_FMT_FLOAT && exp+precision<JX9_FMT_BUFSIZ-30 ){
          flag_dp = (precision>0 || flag_alternateform);
          if( prefix ) *(zBuf++) = (char)prefix;         /* Sign */
          if( exp<0 )  *(zBuf++) = '0';            /* Digits before "." */
          else for(; exp>=0; exp--) *(zBuf++) = (char)vxGetdigit(&realvalue, &nsd);
          if( flag_dp ) *(zBuf++) = '.';           /* The decimal point */
          for(exp++; exp<0 && precision>0; precision--, exp++){
            *(zBuf++) = '0';
          }
          while( (precision--)>0 ) *(zBuf++) = (char)vxGetdigit(&realvalue, &nsd);
          *(zBuf--) = 0;                           /* Null terminate */
          if( flag_rtz && flag_dp ){     /* Remove trailing zeros and "." */
            while( zBuf>=zWorker && *zBuf=='0' ) *(zBuf--) = 0;
            if( zBuf>=zWorker && *zBuf=='.' ) *(zBuf--) = 0;
          }
          zBuf++;                            /* point to next free slot */
        }else{    /* etEXP or etGENERIC */
          flag_dp = (precision>0 || flag_alternateform);
          if( prefix ) *(zBuf++) = (char)prefix;   /* Sign */
          *(zBuf++) = (char)vxGetdigit(&realvalue, &nsd);  /* First digit */
          if( flag_dp ) *(zBuf++) = '.';     /* Decimal point */
          while( (precision--)>0 ) *(zBuf++) = (char)vxGetdigit(&realvalue, &nsd);
          zBuf--;                            /* point to last digit */
          if( flag_rtz && flag_dp ){          /* Remove tail zeros */
            while( zBuf>=zWorker && *zBuf=='0' ) *(zBuf--) = 0;
            if( zBuf>=zWorker && *zBuf=='.' ) *(zBuf--) = 0;
          }
          zBuf++;                            /* point to next free slot */
          if( exp || flag_exp ){
            *(zBuf++) = pInfo->charset[0];
            if( exp<0 ){ *(zBuf++) = '-'; exp = -exp; } /* sign of exp */
            else       { *(zBuf++) = '+'; }
            if( exp>=100 ){
              *(zBuf++) = (char)((exp/100)+'0');                /* 100's digit */
              exp %= 100;
            }
            *(zBuf++) = (char)(exp/10+'0');                     /* 10's digit */
            *(zBuf++) = (char)(exp%10+'0');                     /* 1's digit */
          }
        }
        /* The converted number is in buf[] and zero terminated.Output it.
        ** Note that the number is in the usual order, not reversed as with
        ** integer conversions.*/
        length = (int)(zBuf-zWorker);
        zBuf = zWorker;
        /* Special case:  Add leading zeros if the flag_zeropad flag is
        ** set and we are not left justified */
        if( flag_zeropad && !flag_leftjustify && length < width){
          int i;
          int nPad = width - length;
          for(i=width; i>=nPad; i--){
            zBuf[i] = zBuf[i-nPad];
          }
          i = prefix!=0;
          while( nPad-- ) zBuf[i++] = '0';
          length = width;
        }
#else
         zBuf = " ";
		 length = (int)sizeof(char);
#endif /* JX9_OMIT_FLOATING_POINT */
		 break;
							 }
		default:
			/* Invalid format specifer */
			zWorker[0] = '?';
			length = (int)sizeof(char);
			break;
		}
		 /*
		 ** The text of the conversion is pointed to by "zBuf" and is
		 ** "length" characters long.The field width is "width".Do
		 ** the output.
		 */
    if( !flag_leftjustify ){
      register int nspace;
      nspace = width-length;
      if( nspace>0 ){
        while( nspace>=etSPACESIZE ){
			rc = xConsumer(pCtx, spaces, etSPACESIZE, pUserData);
			if( rc != SXRET_OK ){
				return SXERR_ABORT; /* Consumer routine request an operation abort */
			}
			nspace -= etSPACESIZE;
        }
        if( nspace>0 ){
			rc = xConsumer(pCtx, spaces, (unsigned int)nspace, pUserData);
			if( rc != SXRET_OK ){
				return SXERR_ABORT; /* Consumer routine request an operation abort */
			}
		}
      }
    }
    if( length>0 ){
		rc = xConsumer(pCtx, zBuf, (unsigned int)length, pUserData);
		if( rc != SXRET_OK ){
		  return SXERR_ABORT; /* Consumer routine request an operation abort */
		}
    }
    if( flag_leftjustify ){
      register int nspace;
      nspace = width-length;
      if( nspace>0 ){
        while( nspace>=etSPACESIZE ){
			rc = xConsumer(pCtx, spaces, etSPACESIZE, pUserData);
			if( rc != SXRET_OK ){
				return SXERR_ABORT; /* Consumer routine request an operation abort */
			}
			nspace -= etSPACESIZE;
        }
        if( nspace>0 ){
			rc = xConsumer(pCtx, spaces, (unsigned int)nspace, pUserData);
			if( rc != SXRET_OK ){
				return SXERR_ABORT; /* Consumer routine request an operation abort */
			}
		}
      }
    }
 }/* for(;;) */
	return SXRET_OK;
}